

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::rebuildOrderHeap(Solver *this)

{
  vec<int> vs;
  int local_3c;
  vec<int> local_38;
  
  local_38.data = (int *)0x0;
  local_38.sz = 0;
  local_38.cap = 0;
  local_3c = 0;
  if (0 < (this->vardata).sz) {
    do {
      if (((this->decision).data[local_3c] != '\0') &&
         (((this->assigns).data[local_3c].value & 2) != 0)) {
        vec<int>::push(&local_38,&local_3c);
      }
      local_3c = local_3c + 1;
    } while (local_3c < (this->vardata).sz);
  }
  Heap<Glucose::Solver::VarOrderLt>::build(&this->order_heap,&local_38);
  if (local_38.data != (int *)0x0) {
    local_38._8_8_ = local_38._8_8_ & 0xffffffff00000000;
    free(local_38.data);
  }
  return;
}

Assistant:

void Solver::rebuildOrderHeap() {
    vec <Var> vs;
    for(Var v = 0; v < nVars(); v++)
        if(decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);

}